

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O2

void benchmark::ReplaceAll(string *str,string *from,string *to)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)str,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)str,uVar1,(string *)from->_M_string_length);
  }
  return;
}

Assistant:

void ReplaceAll(std::string* str, const std::string& from,
                const std::string& to) {
  std::size_t start = 0;
  while((start = str->find(from, start)) != std::string::npos) {
    str->replace(start, from.length(), to);
    start += to.length();
  }
}